

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O2

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_back_by_c_str_Test<wchar_t>::Body
          (iu_StringViewSplit_x_iutest_x_chain_back_by_c_str_Test<wchar_t> *this)

{
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *in_R9;
  split_helper_subroutine<detail::get_back,_const_wchar_t_*,_wchar_t> local_208;
  iuCodeMessage local_200;
  AssertionResult iutest_ar;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> s;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_198 [24];
  
  s._M_len = 0x13;
  s._M_str = L"arikitari na_world!";
  local_200.m_message._M_dataplus._M_p = "world!";
  local_208.delim = L"_ ";
  local_198[0] = detail::
                 operator|<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_const_wchar_t_*,_wchar_t,_nullptr>
                           (&s,&local_208);
  iutest::internal::
  CmpHelperEQ<wchar_t_const*,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
            (&iutest_ar,(internal *)"constant::world<char_type>()","s | split(delim) >> back()",
             (char *)&local_200,(wchar_t **)local_198,in_R9);
  if (iutest_ar.m_result == false) {
    memset(local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_200,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
               ,0x39,iutest_ar.m_message._M_dataplus._M_p);
    local_200._44_4_ = 2;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_200,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&local_200);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_back_by_c_str)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	constexpr auto delim = constant::space_underscore<char_type>();
	IUTEST_ASSERT_EQ(constant::world<char_type>(), s | split(delim) >> back());
}